

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_RepeatedFieldMapTest_MultipleFieldPathsAsKey_Test::TestBody
          (MessageDifferencerTest_RepeatedFieldMapTest_MultipleFieldPathsAsKey_Test *this)

{
  RepeatedPtrField<proto2_unittest::TestDiffMessage_Item> *this_00;
  RepeatedPtrField<proto2_unittest::TestDiffMessage_Item> *this_01;
  bool bVar1;
  Value<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>_>
  *pVVar2;
  TestField *pTVar3;
  FieldDescriptor *pFVar4;
  Arena *pAVar5;
  pointer *__ptr;
  char *message;
  char *in_R9;
  AssertHelper local_3f8;
  string output;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar_;
  AssertHelper local_3a0;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  key_field_path1;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  key_field_paths;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  key_field_path2;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  MessageDifferencer differencer;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg1);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&msg2);
  this_00 = &msg1.field_0._impl_.item_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_00->super_RepeatedPtrFieldBase);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  (pTVar3->field_0)._impl_.a_ = 1;
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 4;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,2);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,3);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar5 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"a",pAVar5);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_00->super_RepeatedPtrFieldBase);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  (pTVar3->field_0)._impl_.a_ = 2;
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 4;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,1);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,3);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar5 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"b",pAVar5);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_00->super_RepeatedPtrFieldBase);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  (pTVar3->field_0)._impl_.a_ = 1;
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 4;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,1);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,3);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar5 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"c",pAVar5);
  this_01 = &msg2.field_0._impl_.item_;
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_01->super_RepeatedPtrFieldBase);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  (pTVar3->field_0)._impl_.a_ = 1;
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 4;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,3);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,1);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar5 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"c",pAVar5);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_01->super_RepeatedPtrFieldBase);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  (pTVar3->field_0)._impl_.a_ = 1;
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 4;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,3);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,2);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar5 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"a",pAVar5);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_01->super_RepeatedPtrFieldBase);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  (pTVar3->field_0)._impl_.a_ = 2;
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 4;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,3);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,1);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar5 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"b",pAVar5);
  util::MessageDifferencer::MessageDifferencer(&differencer);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"item.m.rc",(allocator<char> *)&gtest_ar_);
  pFVar4 = GetFieldDescriptor(&msg1.super_Message,&output);
  util::MessageDifferencer::TreatAsSet(&differencer,pFVar4);
  std::__cxx11::string::~string((string *)&output);
  bVar1 = util::MessageDifferencer::Compare(&differencer,&msg1.super_Message,&msg2.super_Message);
  gtest_ar_.success_ = !bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&key_field_paths);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&output,(internal *)&gtest_ar_,(AssertionResult *)0xf0d901,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&key_field_path1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8c5,output._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&key_field_path1,(Message *)&key_field_paths);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&key_field_path1);
    std::__cxx11::string::~string((string *)&output);
    if (key_field_paths.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      (*(code *)((key_field_paths.
                  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start[1])();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  key_field_paths.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  key_field_paths.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  key_field_paths.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  key_field_path1.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  key_field_path1.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  key_field_path1.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"item.m",(allocator<char> *)&key_field_path2);
  gtest_ar_._0_8_ = GetFieldDescriptor(&msg1.super_Message,&output);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&key_field_path1,(FieldDescriptor **)&gtest_ar_);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"item.m.a",(allocator<char> *)&key_field_path2);
  gtest_ar_._0_8_ = GetFieldDescriptor(&msg1.super_Message,&output);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&key_field_path1,(FieldDescriptor **)&gtest_ar_);
  std::__cxx11::string::~string((string *)&output);
  key_field_path2.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  key_field_path2.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  key_field_path2.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"item.m",(allocator<char> *)&gtest_ar__2);
  gtest_ar_._0_8_ = GetFieldDescriptor(&msg1.super_Message,&output);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&key_field_path2,(FieldDescriptor **)&gtest_ar_);
  std::__cxx11::string::~string((string *)&output);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"item.m.rc",(allocator<char> *)&gtest_ar__2);
  gtest_ar_._0_8_ = GetFieldDescriptor(&msg1.super_Message,&output);
  std::
  vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
  ::emplace_back<google::protobuf::FieldDescriptor_const*>
            ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
              *)&key_field_path2,(FieldDescriptor **)&gtest_ar_);
  std::__cxx11::string::~string((string *)&output);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::push_back(&key_field_paths,&key_field_path1);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::push_back(&key_field_paths,&key_field_path2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&output,"item",(allocator<char> *)&gtest_ar_);
  pFVar4 = GetFieldDescriptor(&msg1.super_Message,&output);
  util::MessageDifferencer::TreatAsMapWithMultipleFieldPathsAsKey
            (&differencer,pFVar4,&key_field_paths);
  std::__cxx11::string::~string((string *)&output);
  bVar1 = util::MessageDifferencer::Compare(&differencer,&msg1.super_Message,&msg2.super_Message);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar__2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&output,(internal *)&gtest_ar_,(AssertionResult *)0xf0d901,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8d1,output._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_3f8,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    std::__cxx11::string::~string((string *)&output);
    if ((long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
            (&this_00->super_RepeatedPtrFieldBase);
  internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
            (&this_01->super_RepeatedPtrFieldBase);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_00->super_RepeatedPtrFieldBase);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  (pTVar3->field_0)._impl_.a_ = 4;
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 4;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,5);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,6);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar5 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"hello",pAVar5);
  pVVar2 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestDiffMessage_Item>>
                     (&this_01->super_RepeatedPtrFieldBase);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  (pTVar3->field_0)._impl_.a_ = 4;
  *(byte *)&pTVar3->field_0 = *(byte *)&pTVar3->field_0 | 4;
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,6);
  pTVar3 = proto2_unittest::TestDiffMessage_Item::mutable_m(pVVar2);
  RepeatedField<int>::Add(&(pTVar3->field_0)._impl_.rc_,5);
  *(byte *)&pVVar2->field_0 = *(byte *)&pVVar2->field_0 | 1;
  pAVar5 = (Arena *)(pVVar2->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pAVar5 & 1) != 0) {
    pAVar5 = *(Arena **)((ulong)pAVar5 & 0xfffffffffffffffe);
  }
  internal::ArenaStringPtr::Set(&(pVVar2->field_0)._impl_.b_,"world",pAVar5);
  output._M_dataplus._M_p = (pointer)&output.field_2;
  output._M_string_length = 0;
  output.field_2._M_local_buf[0] = '\0';
  util::MessageDifferencer::ReportDifferencesToString(&differencer,&output);
  bVar1 = util::MessageDifferencer::Compare(&differencer,&msg1.super_Message,&msg2.super_Message);
  gtest_ar__2.success_ = !bVar1;
  gtest_ar__2.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (bVar1) {
    testing::Message::Message((Message *)&local_3f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar_,(internal *)&gtest_ar__2,(AssertionResult *)0xf0d901,"true",
               "false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8e2,(char *)gtest_ar_._0_8_);
    testing::internal::AssertHelper::operator=(&local_3a0,(Message *)&local_3f8);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    std::__cxx11::string::~string((string *)&gtest_ar_);
    if (local_3f8.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_3f8.data_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar__2.message_);
  testing::internal::CmpHelperEQ<char[133],std::__cxx11::string>
            ((internal *)&gtest_ar_,
             "\"modified: item[0].b: \\\"hello\\\" -> \\\"world\\\"\\n\" \"moved: item[0].m.rc[0] -> item[0].m.rc[1] : 5\\n\" \"moved: item[0].m.rc[1] -> item[0].m.rc[0] : 6\\n\""
             ,"output",
             (char (*) [133])
             "modified: item[0].b: \"hello\" -> \"world\"\nmoved: item[0].m.rc[0] -> item[0].m.rc[1] : 5\nmoved: item[0].m.rc[1] -> item[0].m.rc[0] : 6\n"
             ,&output);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar__2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      message = anon_var_dwarf_651463 + 5;
    }
    else {
      message = *(char **)gtest_ar_.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_3f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x8e7,message);
    testing::internal::AssertHelper::operator=(&local_3f8,(Message *)&gtest_ar__2);
    testing::internal::AssertHelper::~AssertHelper(&local_3f8);
    if ((long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(gtest_ar__2._1_7_,gtest_ar__2.success_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&output);
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&key_field_path2.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&key_field_path1.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::~vector(&key_field_paths);
  util::MessageDifferencer::~MessageDifferencer(&differencer);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg2);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&msg1);
  return;
}

Assistant:

TEST(MessageDifferencerTest, RepeatedFieldMapTest_MultipleFieldPathsAsKey) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  // Treat "item" as Map, with key = ("m.a", "m.rc")
  // Treat "item.m.rc" as Set
  proto2_unittest::TestDiffMessage::Item* item = msg1.add_item();
  // key => value: (1, {2, 3}) => "a"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(2);
  item->mutable_m()->add_rc(3);
  item->set_b("a");
  item = msg1.add_item();
  // key => value: (2, {1, 3}) => "b"
  item->mutable_m()->set_a(2);
  item->mutable_m()->add_rc(1);
  item->mutable_m()->add_rc(3);
  item->set_b("b");
  item = msg1.add_item();
  // key => value: (1, {1, 3}) => "c"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(1);
  item->mutable_m()->add_rc(3);
  item->set_b("c");

  item = msg2.add_item();
  // key => value: (1, {1, 3}) => "c"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(3);
  item->mutable_m()->add_rc(1);
  item->set_b("c");
  item = msg2.add_item();
  // key => value: (1, {2, 3}) => "a"
  item->mutable_m()->set_a(1);
  item->mutable_m()->add_rc(3);
  item->mutable_m()->add_rc(2);
  item->set_b("a");
  item = msg2.add_item();
  // key => value: (2, {1, 3}) => "b"
  item->mutable_m()->set_a(2);
  item->mutable_m()->add_rc(3);
  item->mutable_m()->add_rc(1);
  item->set_b("b");

  // Compare
  util::MessageDifferencer differencer;
  differencer.TreatAsSet(GetFieldDescriptor(msg1, "item.m.rc"));
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  std::vector<std::vector<const FieldDescriptor*> > key_field_paths;
  std::vector<const FieldDescriptor*> key_field_path1;
  key_field_path1.push_back(GetFieldDescriptor(msg1, "item.m"));
  key_field_path1.push_back(GetFieldDescriptor(msg1, "item.m.a"));
  std::vector<const FieldDescriptor*> key_field_path2;
  key_field_path2.push_back(GetFieldDescriptor(msg1, "item.m"));
  key_field_path2.push_back(GetFieldDescriptor(msg1, "item.m.rc"));
  key_field_paths.push_back(key_field_path1);
  key_field_paths.push_back(key_field_path2);
  differencer.TreatAsMapWithMultipleFieldPathsAsKey(
      GetFieldDescriptor(msg1, "item"), key_field_paths);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));

  // Introduce some differences.
  msg1.clear_item();
  msg2.clear_item();
  item = msg1.add_item();
  item->mutable_m()->set_a(4);
  item->mutable_m()->add_rc(5);
  item->mutable_m()->add_rc(6);
  item->set_b("hello");
  item = msg2.add_item();
  item->mutable_m()->set_a(4);
  item->mutable_m()->add_rc(6);
  item->mutable_m()->add_rc(5);
  item->set_b("world");
  std::string output;
  differencer.ReportDifferencesToString(&output);
  EXPECT_FALSE(differencer.Compare(msg1, msg2));
  EXPECT_EQ(
      "modified: item[0].b: \"hello\" -> \"world\"\n"
      "moved: item[0].m.rc[0] -> item[0].m.rc[1] : 5\n"
      "moved: item[0].m.rc[1] -> item[0].m.rc[0] : 6\n",
      output);
}